

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessage
          (LogMessage *this,Nonnull<const_char_*> file,int line,LogSeverity severity)

{
  int *piVar1;
  LogMessageData *this_00;
  pointer *__ptr;
  Time timestamp;
  
  piVar1 = __errno_location();
  (this->errno_saver_).saved_errno_ = *piVar1;
  timestamp = Now();
  this_00 = (LogMessageData *)operator_new(0x7770);
  LogMessageData::LogMessageData(this_00,file,line,severity,timestamp);
  (this->data_)._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = this_00;
  this_00->first_fatal = false;
  this_00->fail_quietly = false;
  this_00->is_perror = false;
  LogBacktraceIfNeeded(this);
  return;
}

Assistant:

LogMessage::LogMessage(absl::Nonnull<const char*> file, int line,
                       absl::LogSeverity severity)
    : data_(absl::make_unique<LogMessageData>(file, line, severity,
                                              absl::Now())) {
  data_->first_fatal = false;
  data_->is_perror = false;
  data_->fail_quietly = false;

  // This logs a backtrace even if the location is subsequently changed using
  // AtLocation.  This quirk, and the behavior when AtLocation is called twice,
  // are fixable but probably not worth fixing.
  LogBacktraceIfNeeded();
}